

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_fp16s(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  Mat *this_01;
  uint _h;
  size_t sVar1;
  _func_int *p_Var2;
  int *piVar3;
  unsigned_short uVar4;
  uint _w;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  undefined1 (*pauVar16) [16];
  long lVar17;
  void *pvVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  unsigned_short *puVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  void *local_1f0;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  Mat local_168;
  InnerProduct_x86_avx512 *local_120;
  undefined8 local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  uint local_f4;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  void *local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  this_01 = (Mat *)(&this->field_0x130 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  _h = this_01[-2].h;
  _w = this_01[-2].c / (int)_h;
  this_00 = &this->weight_data_tm;
  if (opt->use_packing_layout == true) {
    local_120 = this;
    if ((_h & 0xf) == 0) {
      Mat::reshape(&local_168,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 4,0x20,0x10,(Allocator *)0x0);
      if (0xf < (int)_h) {
        local_f4 = _w & 0xfffffff0;
        lVar13 = 1;
        lVar17 = 2;
        lVar19 = 3;
        lVar20 = 4;
        lVar9 = 5;
        lVar21 = 6;
        local_a0 = 7;
        local_a8 = 8;
        local_b0 = 9;
        local_b8 = 10;
        local_c0 = 0xb;
        local_c8 = 0xc;
        local_d0 = 0xd;
        local_d8 = 0xe;
        local_e0 = 0xf;
        local_e8 = 0;
        uVar25 = 0;
        do {
          lVar28 = (long)(this->weight_data_tm).w;
          pvVar12 = (this->weight_data_tm).data;
          sVar1 = (this->weight_data_tm).elemsize;
          lVar10 = (long)local_168.w;
          if ((int)_w < 0x10) {
            lVar27 = (uVar25 >> 4) * lVar28 * sVar1;
            lVar10 = local_168.elemsize * lVar10;
            lVar22 = (uVar25 | 1) * lVar10;
            local_1b8 = (uVar25 | 2) * lVar10;
            local_198 = (uVar25 | 3) * lVar10;
            local_1c0 = (uVar25 | 4) * lVar10;
            local_1b0 = (uVar25 | 5) * lVar10;
            local_188 = (uVar25 | 6) * lVar10;
            local_1a0 = (uVar25 | 7) * lVar10;
            local_1a8 = (uVar25 | 8) * lVar10;
            local_190 = (uVar25 | 9) * lVar10;
            lVar23 = (uVar25 | 10) * lVar10;
            lVar7 = (uVar25 | 0xb) * lVar10;
            lVar8 = (uVar25 | 0xc) * lVar10;
            lVar14 = (uVar25 | 0xd) * lVar10;
            local_180 = (uVar25 | 0xe) * lVar10;
            lVar26 = lVar10 * (uVar25 | 0xf);
            lVar28 = lVar10 * uVar25;
            uVar6 = 0;
          }
          else {
            local_98 = sVar1 * local_e8 * lVar28;
            local_f0 = local_168.elemsize * uVar25 * lVar10;
            lVar22 = local_168.elemsize * lVar13 * lVar10;
            local_1b8 = local_168.elemsize * lVar17 * lVar10;
            local_198 = local_168.elemsize * lVar19 * lVar10;
            local_1c0 = local_168.elemsize * lVar20 * lVar10;
            local_1b0 = local_168.elemsize * lVar9 * lVar10;
            local_188 = local_168.elemsize * lVar21 * lVar10;
            local_1a0 = local_168.elemsize * local_a0 * lVar10;
            local_1a8 = local_168.elemsize * local_a8 * lVar10;
            local_190 = local_168.elemsize * local_b0 * lVar10;
            lVar23 = local_168.elemsize * local_b8 * lVar10;
            lVar7 = local_168.elemsize * local_c0 * lVar10;
            lVar8 = local_168.elemsize * local_c8 * lVar10;
            lVar14 = local_168.elemsize * local_d0 * lVar10;
            local_180 = local_168.elemsize * local_d8 * lVar10;
            lVar10 = local_168.elemsize * local_e0 * lVar10;
            local_100 = (void *)((long)local_168.data + local_f0);
            local_108 = (void *)((long)local_168.data + lVar22);
            local_110 = (void *)((long)local_168.data + local_1b8);
            local_118 = (void *)((long)local_168.data + local_198);
            local_38 = (void *)((long)local_168.data + local_1c0);
            local_40 = (void *)((long)local_168.data + local_1b0);
            local_48 = (void *)((long)local_168.data + local_188);
            local_50 = (void *)((long)local_168.data + local_1a0);
            local_90 = local_168.data;
            iVar11 = 0xf;
            lVar27 = 0;
            lVar26 = 0;
            do {
              auVar44 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_100 + lVar26),3);
              auVar45 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_108 + lVar26),3);
              auVar46 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_110 + lVar26),3);
              auVar47 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_118 + lVar26),3);
              auVar29 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_38 + lVar26),3);
              auVar30 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_40 + lVar26),3);
              auVar31 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_48 + lVar26),3);
              auVar48 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_50 + lVar26),3);
              auVar32 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + local_1a8),3);
              auVar33 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + local_190),3);
              auVar34 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + lVar23),3);
              auVar35 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + lVar7),3);
              auVar36 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + lVar8),3);
              auVar37 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + lVar14),3);
              auVar38 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + local_180),3);
              auVar39 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar26 + lVar10),3);
              auVar40 = vpunpcklwd_avx512vl(auVar44,auVar45);
              auVar44 = vpunpckhwd_avx2(auVar44,auVar45);
              auVar49 = vpunpcklwd_avx2(auVar46,auVar47);
              auVar45 = vpunpckhwd_avx2(auVar46,auVar47);
              auVar50 = vpunpcklwd_avx2(auVar29,auVar30);
              auVar46 = vpunpckhwd_avx2(auVar29,auVar30);
              auVar51 = vpunpcklwd_avx2(auVar31,auVar48);
              auVar47 = vpunpckhwd_avx2(auVar31,auVar48);
              auVar63 = vpunpcklwd_avx2(auVar32,auVar33);
              auVar29 = vpunpckhwd_avx2(auVar32,auVar33);
              auVar32 = vpunpcklwd_avx2(auVar34,auVar35);
              auVar30 = vpunpckhwd_avx2(auVar34,auVar35);
              auVar33 = vpunpcklwd_avx2(auVar36,auVar37);
              auVar31 = vpunpckhwd_avx2(auVar36,auVar37);
              auVar34 = vpunpcklwd_avx2(auVar38,auVar39);
              auVar48 = vpunpckhwd_avx2(auVar38,auVar39);
              auVar35 = vpunpckldq_avx512vl(auVar40,auVar49);
              auVar36 = vpunpckhdq_avx512vl(auVar40,auVar49);
              auVar37 = vpunpckldq_avx512vl(auVar44,auVar45);
              auVar44 = vpunpckhdq_avx2(auVar44,auVar45);
              auVar49 = vpunpckldq_avx2(auVar50,auVar51);
              auVar45 = vpunpckhdq_avx2(auVar50,auVar51);
              auVar50 = vpunpckldq_avx2(auVar46,auVar47);
              auVar46 = vpunpckhdq_avx2(auVar46,auVar47);
              auVar51 = vpunpckldq_avx2(auVar63,auVar32);
              auVar47 = vpunpckhdq_avx2(auVar63,auVar32);
              auVar63 = vpunpckldq_avx2(auVar29,auVar30);
              auVar29 = vpunpckhdq_avx2(auVar29,auVar30);
              auVar32 = vpunpckldq_avx2(auVar33,auVar34);
              auVar30 = vpunpckhdq_avx2(auVar33,auVar34);
              auVar33 = vpunpckldq_avx2(auVar31,auVar48);
              auVar31 = vpunpckhdq_avx2(auVar31,auVar48);
              auVar34 = vpunpcklqdq_avx2(auVar35,auVar49);
              auVar48 = vpunpckhqdq_avx2(auVar35,auVar49);
              auVar49 = vpunpcklqdq_avx2(auVar36,auVar45);
              auVar45 = vpunpckhqdq_avx2(auVar36,auVar45);
              auVar35 = vpunpcklqdq_avx512vl(auVar37,auVar50);
              auVar36 = vpunpckhqdq_avx512vl(auVar37,auVar50);
              auVar37 = vpunpcklqdq_avx512vl(auVar44,auVar46);
              auVar44 = vpunpckhqdq_avx2(auVar44,auVar46);
              auVar50 = vpunpcklqdq_avx2(auVar51,auVar32);
              auVar46 = vpunpckhqdq_avx2(auVar51,auVar32);
              auVar51 = vpunpcklqdq_avx2(auVar47,auVar30);
              auVar47 = vpunpckhqdq_avx2(auVar47,auVar30);
              auVar32 = vpunpcklqdq_avx2(auVar63,auVar33);
              auVar30 = vpunpckhqdq_avx2(auVar63,auVar33);
              auVar63 = vpunpcklqdq_avx2(auVar29,auVar31);
              auVar29 = vpunpckhqdq_avx2(auVar29,auVar31);
              auVar66._0_16_ = ZEXT116(0) * auVar50._0_16_ + ZEXT116(1) * auVar34._0_16_;
              auVar66._16_16_ = ZEXT116(0) * auVar34._16_16_ + ZEXT116(1) * auVar50._0_16_;
              auVar33 = vinserti32x4_avx512vl(auVar48,auVar46._0_16_,1);
              auVar38 = vinserti32x4_avx512vl(auVar49,auVar51._0_16_,1);
              auVar39 = vinserti32x4_avx512vl(auVar45,auVar47._0_16_,1);
              auVar40 = vinserti32x4_avx512vl(auVar35,auVar32._0_16_,1);
              auVar41 = vinserti32x4_avx512vl(auVar36,auVar30._0_16_,1);
              auVar42 = vinserti32x4_avx512vl(auVar37,auVar63._0_16_,1);
              auVar43 = vinserti32x4_avx512vl(auVar44,auVar29._0_16_,1);
              auVar31 = vperm2i128_avx2(auVar34,auVar50,0x31);
              auVar46 = vperm2i128_avx2(auVar48,auVar46,0x31);
              auVar48 = vperm2i128_avx2(auVar49,auVar51,0x31);
              auVar45 = vperm2i128_avx2(auVar45,auVar47,0x31);
              auVar47 = vperm2i128_avx2(auVar35,auVar32,0x31);
              auVar30 = vperm2i128_avx2(auVar36,auVar30,0x31);
              auVar49 = vshufi64x2_avx512vl(auVar37,auVar63,3);
              auVar29 = vperm2i128_avx2(auVar44,auVar29,0x31);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98) = auVar66;
              auVar44 = vmovdqu64_avx512vl(auVar33);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x20) = auVar44;
              auVar44 = vmovdqu64_avx512vl(auVar38);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x40) = auVar44;
              auVar44 = vmovdqu64_avx512vl(auVar39);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x60) = auVar44;
              auVar44 = vmovdqu64_avx512vl(auVar40);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x80) = auVar44;
              auVar44 = vmovdqu64_avx512vl(auVar41);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0xa0) = auVar44;
              auVar44 = vmovdqu64_avx512vl(auVar42);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0xc0) = auVar44;
              auVar44 = vmovdqu64_avx512vl(auVar43);
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0xe0) = auVar44;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x100) = auVar31;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x120) = auVar46;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x140) = auVar48;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x160) = auVar45;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x180) = auVar47;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x1a0) = auVar30;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x1c0) = auVar49;
              *(undefined1 (*) [32])((long)pvVar12 + lVar26 * 8 + local_98 + 0x1e0) = auVar29;
              lVar26 = lVar26 + 0x40;
              lVar27 = lVar27 + 0x200;
              iVar11 = iVar11 + 0x10;
            } while (iVar11 < (int)_w);
            lVar27 = local_98 + lVar27;
            lVar28 = local_f0 + lVar26;
            lVar22 = lVar22 + lVar26;
            local_1b8 = local_1b8 + lVar26;
            local_198 = local_198 + lVar26;
            local_1c0 = local_1c0 + lVar26;
            local_1b0 = local_1b0 + lVar26;
            local_188 = local_188 + lVar26;
            local_1a0 = local_1a0 + lVar26;
            local_1a8 = local_1a8 + lVar26;
            local_190 = local_190 + lVar26;
            lVar23 = lVar23 + lVar26;
            lVar7 = lVar7 + lVar26;
            lVar8 = lVar8 + lVar26;
            lVar14 = lVar14 + lVar26;
            local_180 = local_180 + lVar26;
            lVar26 = lVar10 + lVar26;
            uVar6 = local_f4;
          }
          lVar27 = (long)pvVar12 + lVar27;
          local_180 = (long)local_168.data + local_180;
          local_188 = (long)local_168.data + local_188;
          local_190 = (long)local_168.data + local_190;
          local_198 = (long)local_168.data + local_198;
          local_1a0 = (long)local_168.data + local_1a0;
          local_1a8 = (long)local_168.data + local_1a8;
          local_1c0 = (long)local_168.data + local_1c0;
          local_1b0 = (long)local_168.data + local_1b0;
          local_1d0 = (void *)((long)local_168.data + lVar14);
          local_1e0 = (void *)((long)local_168.data + lVar7);
          local_1c8 = (void *)((long)local_168.data + lVar8);
          local_1f0 = (void *)((long)local_168.data + lVar23);
          lVar28 = (long)local_168.data + lVar28;
          local_1d8 = (void *)((long)local_168.data + lVar26);
          local_1b8 = (long)local_168.data + local_1b8;
          local_1e8 = (void *)((long)local_168.data + lVar22);
          if ((int)(uVar6 | 7) < (int)_w) {
            lVar22 = 0;
            lVar10 = 0;
            uVar5 = uVar6;
            do {
              auVar52 = vcvtps2ph_f16c(*(undefined1 (*) [32])(lVar28 + lVar10),3);
              auVar53 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e8 + lVar10),3);
              auVar54 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b8 + lVar10),3);
              auVar55 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_198 + lVar10),3);
              auVar56 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1c0 + lVar10),3);
              auVar58 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b0 + lVar10),3);
              auVar60 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_188 + lVar10),3);
              auVar57 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1a0 + lVar10),3);
              auVar59 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1a8 + lVar10),3);
              auVar61 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_190 + lVar10),3);
              auVar62 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f0 + lVar10),3);
              auVar64 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar10),3);
              auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1c8 + lVar10),3);
              auVar67 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d0 + lVar10),3);
              auVar68 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_180 + lVar10),3);
              auVar69 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d8 + lVar10),3);
              auVar44._0_16_ = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar52;
              auVar44._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59
              ;
              auVar45._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar53;
              auVar45._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61
              ;
              auVar46._0_16_ = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar54;
              auVar46._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar62
              ;
              auVar47._0_16_ = ZEXT116(0) * auVar64 + ZEXT116(1) * auVar55;
              auVar47._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64
              ;
              auVar48._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar56;
              auVar48._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65
              ;
              auVar49._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar58;
              auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67
              ;
              auVar50._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar60;
              auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68
              ;
              auVar51._0_16_ = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar57;
              auVar51._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69
              ;
              auVar29 = vpunpcklwd_avx2(auVar44,auVar45);
              auVar44 = vpunpckhwd_avx2(auVar44,auVar45);
              auVar30 = vpunpcklwd_avx2(auVar46,auVar47);
              auVar45 = vpunpckhwd_avx2(auVar46,auVar47);
              auVar31 = vpunpcklwd_avx2(auVar48,auVar49);
              auVar46 = vpunpckhwd_avx2(auVar48,auVar49);
              auVar48 = vpunpcklwd_avx2(auVar50,auVar51);
              auVar47 = vpunpckhwd_avx2(auVar50,auVar51);
              auVar49 = vpunpckldq_avx2(auVar29,auVar30);
              auVar29 = vpunpckhdq_avx2(auVar29,auVar30);
              auVar30 = vpunpckldq_avx2(auVar44,auVar45);
              auVar44 = vpunpckhdq_avx2(auVar44,auVar45);
              auVar50 = vpunpckldq_avx2(auVar31,auVar48);
              auVar45 = vpunpckhdq_avx2(auVar31,auVar48);
              auVar31 = vpunpckldq_avx2(auVar46,auVar47);
              auVar46 = vpunpckhdq_avx2(auVar46,auVar47);
              auVar48 = vpunpcklqdq_avx2(auVar49,auVar50);
              auVar47 = vpunpckhqdq_avx2(auVar49,auVar50);
              auVar49 = vpunpcklqdq_avx2(auVar29,auVar45);
              auVar45 = vpunpckhqdq_avx2(auVar29,auVar45);
              auVar50 = vpunpcklqdq_avx2(auVar30,auVar31);
              auVar29 = vpunpckhqdq_avx2(auVar30,auVar31);
              auVar30 = vpunpcklqdq_avx2(auVar44,auVar46);
              auVar44 = vpunpckhqdq_avx2(auVar44,auVar46);
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8) = auVar48;
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8 + 0x20) = auVar47;
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8 + 0x40) = auVar49;
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8 + 0x60) = auVar45;
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8 + 0x80) = auVar50;
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8 + 0xa0) = auVar29;
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8 + 0xc0) = auVar30;
              *(undefined1 (*) [32])(lVar27 + lVar10 * 8 + 0xe0) = auVar44;
              uVar6 = uVar5 + 8;
              lVar10 = lVar10 + 0x20;
              lVar22 = lVar22 + 0x100;
              iVar11 = uVar5 + 0xf;
              uVar5 = uVar6;
            } while (iVar11 < (int)_w);
            lVar27 = lVar27 + lVar22;
            lVar28 = lVar28 + lVar10;
            local_1e8 = (void *)((long)local_1e8 + lVar10);
            local_1b8 = local_1b8 + lVar10;
            local_198 = local_198 + lVar10;
            local_1c0 = local_1c0 + lVar10;
            local_1b0 = local_1b0 + lVar10;
            local_188 = local_188 + lVar10;
            local_1a0 = local_1a0 + lVar10;
            local_1a8 = local_1a8 + lVar10;
            local_190 = local_190 + lVar10;
            local_1f0 = (void *)((long)local_1f0 + lVar10);
            local_1e0 = (void *)((long)local_1e0 + lVar10);
            local_1c8 = (void *)((long)local_1c8 + lVar10);
            local_1d0 = (void *)((long)local_1d0 + lVar10);
            local_180 = local_180 + lVar10;
            local_1d8 = (void *)((long)local_1d8 + lVar10);
          }
          iVar11 = _w - uVar6;
          local_88 = uVar25;
          local_80 = lVar21;
          local_78 = lVar9;
          local_70 = lVar20;
          local_68 = lVar19;
          local_60 = lVar17;
          local_58 = lVar13;
          if (iVar11 != 0 && (int)uVar6 <= (int)_w) {
            lVar13 = 0;
            do {
              uVar4 = float32_to_float16(*(float *)(lVar28 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1e8 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 2) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_1b8 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 4) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_198 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 6) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_1c0 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 8) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_1b0 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 10) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_188 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0xc) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_1a0 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0xe) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_1a8 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x10) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_190 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x12) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1f0 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x14) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1e0 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x16) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1c8 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x18) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1d0 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x1a) = uVar4;
              uVar4 = float32_to_float16(*(float *)(local_180 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x1c) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1d8 + lVar13));
              *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x1e) = uVar4;
              lVar13 = lVar13 + 4;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
          uVar25 = local_88 + 0x10;
          local_e8 = local_e8 + 1;
          lVar13 = local_58 + 0x10;
          lVar17 = local_60 + 0x10;
          lVar19 = local_68 + 0x10;
          lVar20 = local_70 + 0x10;
          lVar9 = local_78 + 0x10;
          lVar21 = local_80 + 0x10;
          local_a0 = local_a0 + 0x10;
          local_a8 = local_a8 + 0x10;
          local_b0 = local_b0 + 0x10;
          local_b8 = local_b8 + 0x10;
          local_c0 = local_c0 + 0x10;
          local_c8 = local_c8 + 0x10;
          local_d0 = local_d0 + 0x10;
          local_d8 = local_d8 + 0x10;
          local_e0 = local_e0 + 0x10;
          this = local_120;
        } while ((int)((uint)uVar25 | 0xf) < (int)_h);
      }
      if (local_168.refcount == (int *)0x0) goto LAB_002ca89f;
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount != 0) goto LAB_002ca89f;
      if (local_168.allocator != (Allocator *)0x0) {
        (*(local_168.allocator)->_vptr_Allocator[3])();
        goto LAB_002ca89f;
      }
    }
    else if ((_h & 7) == 0) {
      Mat::reshape(&local_168,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x10,8,(Allocator *)0x0);
      if (7 < (int)_h) {
        local_118 = (void *)(CONCAT44(local_118._4_4_,_w) & 0xfffffffffffffff0);
        lVar19 = 1;
        lVar13 = 2;
        lVar20 = 3;
        lVar9 = 4;
        lVar21 = 5;
        local_1a0 = 6;
        local_1a8 = 7;
        lVar17 = 0;
        uVar25 = 0;
        do {
          lVar10 = (long)(this->weight_data_tm).w;
          pvVar12 = (this->weight_data_tm).data;
          sVar1 = (this->weight_data_tm).elemsize;
          lVar28 = (long)local_168.w;
          if ((int)_w < 0x10) {
            puVar24 = (unsigned_short *)((long)pvVar12 + (uVar25 >> 3) * lVar10 * sVar1);
            lVar28 = local_168.elemsize * lVar28;
            pvVar18 = (void *)(lVar28 * uVar25 + (long)local_168.data);
            local_1e8 = (void *)((uVar25 | 1) * lVar28 + (long)local_168.data);
            local_1f0 = (void *)((uVar25 | 2) * lVar28 + (long)local_168.data);
            local_1e0 = (void *)((uVar25 | 3) * lVar28 + (long)local_168.data);
            local_1c8 = (void *)((uVar25 | 4) * lVar28 + (long)local_168.data);
            local_1d0 = (void *)((uVar25 | 5) * lVar28 + (long)local_168.data);
            local_1d8 = (void *)((uVar25 | 6) * lVar28 + (long)local_168.data);
            pvVar12 = (void *)(lVar28 * (uVar25 | 7) + (long)local_168.data);
            uVar6 = 0;
          }
          else {
            local_110 = (void *)(sVar1 * lVar17 * lVar10);
            local_100 = (void *)(local_168.elemsize * uVar25 * lVar28);
            lVar14 = local_168.elemsize * lVar19 * lVar28;
            lVar26 = local_168.elemsize * lVar13 * lVar28;
            lVar22 = local_168.elemsize * lVar20 * lVar28;
            lVar23 = local_168.elemsize * lVar9 * lVar28;
            lVar7 = local_168.elemsize * lVar21 * lVar28;
            lVar8 = local_168.elemsize * local_1a0 * lVar28;
            lVar28 = local_168.elemsize * local_1a8 * lVar28;
            local_108 = local_168.data;
            iVar11 = 0xf;
            lVar27 = 0;
            lVar10 = 0;
            do {
              auVar44 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)((long)local_100 + (long)local_168.data) + lVar10)
                                          ,3);
              auVar45 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar10 + lVar14),3);
              auVar46 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar10 + lVar26),3);
              auVar47 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar10 + lVar22),3);
              auVar48 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar10 + lVar23),3);
              auVar49 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar10 + lVar7),3);
              auVar50 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar10 + lVar8),3);
              auVar51 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_168.data + lVar10 + lVar28),3);
              auVar29 = vpunpcklwd_avx2(auVar44,auVar45);
              auVar44 = vpunpckhwd_avx2(auVar44,auVar45);
              auVar30 = vpunpcklwd_avx2(auVar46,auVar47);
              auVar45 = vpunpckhwd_avx2(auVar46,auVar47);
              auVar31 = vpunpcklwd_avx2(auVar48,auVar49);
              auVar46 = vpunpckhwd_avx2(auVar48,auVar49);
              auVar48 = vpunpcklwd_avx2(auVar50,auVar51);
              auVar47 = vpunpckhwd_avx2(auVar50,auVar51);
              auVar49 = vpunpckldq_avx2(auVar29,auVar30);
              auVar29 = vpunpckhdq_avx2(auVar29,auVar30);
              auVar30 = vpunpckldq_avx2(auVar44,auVar45);
              auVar44 = vpunpckhdq_avx2(auVar44,auVar45);
              auVar50 = vpunpckldq_avx2(auVar31,auVar48);
              auVar45 = vpunpckhdq_avx2(auVar31,auVar48);
              auVar31 = vpunpckldq_avx2(auVar46,auVar47);
              auVar46 = vpunpckhdq_avx2(auVar46,auVar47);
              auVar48 = vpunpcklqdq_avx2(auVar49,auVar50);
              auVar47 = vpunpckhqdq_avx2(auVar49,auVar50);
              auVar49 = vpunpcklqdq_avx2(auVar29,auVar45);
              auVar45 = vpunpckhqdq_avx2(auVar29,auVar45);
              auVar50 = vpunpcklqdq_avx2(auVar30,auVar31);
              auVar29 = vpunpckhqdq_avx2(auVar30,auVar31);
              auVar30 = vpunpcklqdq_avx2(auVar44,auVar46);
              auVar44 = vpunpckhqdq_avx2(auVar44,auVar46);
              auVar31._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar48._0_16_;
              auVar31._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar47._0_16_;
              auVar63._0_16_ = ZEXT116(0) * auVar45._0_16_ + ZEXT116(1) * auVar49._0_16_;
              auVar63._16_16_ = ZEXT116(0) * auVar49._16_16_ + ZEXT116(1) * auVar45._0_16_;
              auVar32._0_16_ = ZEXT116(0) * auVar29._0_16_ + ZEXT116(1) * auVar50._0_16_;
              auVar32._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * auVar29._0_16_;
              auVar33._0_16_ = ZEXT116(0) * auVar44._0_16_ + ZEXT116(1) * auVar30._0_16_;
              auVar33._16_16_ = ZEXT116(0) * auVar30._16_16_ + ZEXT116(1) * auVar44._0_16_;
              auVar46 = vperm2i128_avx2(auVar48,auVar47,0x31);
              auVar45 = vperm2i128_avx2(auVar49,auVar45,0x31);
              auVar47 = vperm2i128_avx2(auVar50,auVar29,0x31);
              auVar44 = vperm2i128_avx2(auVar30,auVar44,0x31);
              *(undefined1 (*) [32])((long)local_110 + (long)(lVar10 * 4 + (long)pvVar12)) = auVar31
              ;
              *(undefined1 (*) [32])((long)local_110 + (long)pvVar12 + lVar10 * 4 + 0x20) = auVar63;
              *(undefined1 (*) [32])((long)local_110 + (long)pvVar12 + lVar10 * 4 + 0x40) = auVar32;
              *(undefined1 (*) [32])((long)local_110 + (long)pvVar12 + lVar10 * 4 + 0x60) = auVar33;
              *(undefined1 (*) [32])((long)local_110 + (long)pvVar12 + lVar10 * 4 + 0x80) = auVar46;
              *(undefined1 (*) [32])((long)local_110 + (long)pvVar12 + lVar10 * 4 + 0xa0) = auVar45;
              *(undefined1 (*) [32])((long)local_110 + (long)pvVar12 + lVar10 * 4 + 0xc0) = auVar47;
              *(undefined1 (*) [32])((long)local_110 + (long)pvVar12 + lVar10 * 4 + 0xe0) = auVar44;
              lVar10 = lVar10 + 0x40;
              lVar27 = lVar27 + 0x100;
              iVar11 = iVar11 + 0x10;
            } while (iVar11 < (int)_w);
            puVar24 = (unsigned_short *)((long)pvVar12 + lVar27 + (long)local_110);
            lVar10 = (long)local_168.data + lVar10;
            pvVar18 = (void *)((long)local_100 + lVar10);
            local_1e8 = (void *)(lVar14 + lVar10);
            local_1f0 = (void *)(lVar26 + lVar10);
            local_1e0 = (void *)(lVar22 + lVar10);
            local_1c8 = (void *)(lVar23 + lVar10);
            local_1d0 = (void *)(lVar7 + lVar10);
            local_1d8 = (void *)(lVar8 + lVar10);
            pvVar12 = (void *)(lVar28 + lVar10);
            uVar6 = (uint)local_118;
          }
          if ((int)(uVar6 | 7) < (int)_w) {
            lVar28 = 0;
            lVar10 = 0;
            uVar5 = uVar6;
            do {
              auVar52 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar18 + lVar10),3);
              auVar53 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e8 + lVar10),3);
              auVar54 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f0 + lVar10),3);
              auVar55 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar10),3);
              auVar57 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1c8 + lVar10),3);
              auVar59 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d0 + lVar10),3);
              auVar61 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d8 + lVar10),3);
              auVar62 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar12 + lVar10),3);
              auVar56 = vpunpcklwd_avx(auVar52,auVar53);
              auVar52 = vpunpckhwd_avx(auVar52,auVar53);
              auVar58 = vpunpcklwd_avx(auVar54,auVar55);
              auVar53 = vpunpckhwd_avx(auVar54,auVar55);
              auVar60 = vpunpcklwd_avx(auVar57,auVar59);
              auVar54 = vpunpckhwd_avx(auVar57,auVar59);
              auVar57 = vpunpcklwd_avx(auVar61,auVar62);
              auVar55 = vpunpckhwd_avx(auVar61,auVar62);
              auVar59 = vpunpckldq_avx(auVar56,auVar58);
              auVar56 = vpunpckhdq_avx(auVar56,auVar58);
              auVar58 = vpunpckldq_avx(auVar52,auVar53);
              auVar52 = vpunpckhdq_avx(auVar52,auVar53);
              auVar61 = vpunpckldq_avx(auVar60,auVar57);
              auVar53 = vpunpckhdq_avx(auVar60,auVar57);
              auVar60 = vpunpckldq_avx(auVar54,auVar55);
              auVar54 = vpunpckhdq_avx(auVar54,auVar55);
              auVar57 = vpunpcklqdq_avx(auVar59,auVar61);
              auVar55 = vpunpckhqdq_avx(auVar59,auVar61);
              auVar59 = vpunpcklqdq_avx(auVar56,auVar53);
              auVar53 = vpunpckhqdq_avx(auVar56,auVar53);
              auVar61 = vpunpcklqdq_avx(auVar58,auVar60);
              auVar56 = vpunpckhqdq_avx(auVar58,auVar60);
              auVar58 = vpunpcklqdq_avx(auVar52,auVar54);
              auVar52 = vpunpckhqdq_avx(auVar52,auVar54);
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2) = auVar57;
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2 + 8) = auVar55;
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2 + 0x10) = auVar59;
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2 + 0x18) = auVar53;
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2 + 0x20) = auVar61;
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2 + 0x28) = auVar56;
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2 + 0x30) = auVar58;
              *(undefined1 (*) [16])(puVar24 + lVar10 * 2 + 0x38) = auVar52;
              uVar6 = uVar5 + 8;
              lVar10 = lVar10 + 0x20;
              lVar28 = lVar28 + 0x80;
              iVar11 = uVar5 + 0xf;
              uVar5 = uVar6;
            } while (iVar11 < (int)_w);
            puVar24 = (unsigned_short *)((long)puVar24 + lVar28);
            pvVar18 = (void *)((long)pvVar18 + lVar10);
            local_1e8 = (void *)((long)local_1e8 + lVar10);
            local_1f0 = (void *)((long)local_1f0 + lVar10);
            local_1e0 = (void *)((long)local_1e0 + lVar10);
            local_1c8 = (void *)((long)local_1c8 + lVar10);
            local_1d0 = (void *)((long)local_1d0 + lVar10);
            local_1d8 = (void *)((long)local_1d8 + lVar10);
            pvVar12 = (void *)((long)pvVar12 + lVar10);
          }
          if ((int)uVar6 < (int)_w) {
            lVar10 = 0;
            do {
              uVar4 = float32_to_float16(*(float *)((long)pvVar18 + lVar10 * 4));
              *puVar24 = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1e8 + lVar10 * 4));
              puVar24[1] = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1f0 + lVar10 * 4));
              puVar24[2] = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1e0 + lVar10 * 4));
              puVar24[3] = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1c8 + lVar10 * 4));
              puVar24[4] = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1d0 + lVar10 * 4));
              puVar24[5] = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)local_1d8 + lVar10 * 4));
              puVar24[6] = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)pvVar12 + lVar10 * 4));
              puVar24[7] = uVar4;
              puVar24 = puVar24 + 8;
              lVar10 = lVar10 + 1;
            } while (_w - uVar6 != (int)lVar10);
          }
          uVar25 = uVar25 + 8;
          lVar17 = lVar17 + 1;
          lVar19 = lVar19 + 8;
          lVar13 = lVar13 + 8;
          lVar20 = lVar20 + 8;
          lVar9 = lVar9 + 8;
          lVar21 = lVar21 + 8;
          local_1a0 = local_1a0 + 8;
          local_1a8 = local_1a8 + 8;
          this = local_120;
        } while ((int)((uint)uVar25 | 7) < (int)_h);
      }
      if (local_168.refcount == (int *)0x0) goto LAB_002ca89f;
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount != 0) goto LAB_002ca89f;
      if (local_168.allocator != (Allocator *)0x0) {
        (*(local_168.allocator)->_vptr_Allocator[3])();
        goto LAB_002ca89f;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002c9107;
      Mat::reshape(&local_168,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,8,4,(Allocator *)0x0);
      if (3 < (int)_h) {
        local_1c0._0_4_ = _w & 0xfffffffc;
        lVar17 = 3;
        lVar19 = 2;
        lVar20 = 1;
        lVar13 = 0;
        uVar25 = 0;
        do {
          pvVar18 = local_168.data;
          lVar9 = (long)(this->weight_data_tm).w;
          pvVar12 = (this->weight_data_tm).data;
          sVar1 = (this->weight_data_tm).elemsize;
          pauVar15 = (undefined1 (*) [16])((uVar25 >> 2) * lVar9 * sVar1 + (long)pvVar12);
          lVar21 = (long)local_168.w;
          if ((int)_w < 4) {
            lVar21 = local_168.elemsize * lVar21;
            lVar23 = lVar21 * uVar25;
            lVar22 = (uVar25 | 1) * lVar21;
            lVar28 = (uVar25 | 2) * lVar21;
            lVar10 = lVar21 * (uVar25 | 3);
            uVar6 = 0;
          }
          else {
            lVar10 = local_168.elemsize * lVar17 * lVar21;
            lVar28 = local_168.elemsize * lVar19 * lVar21;
            lVar22 = local_168.elemsize * lVar20 * lVar21;
            lVar21 = local_168.elemsize * uVar25 * lVar21;
            iVar11 = 3;
            lVar23 = 0;
            do {
              pauVar16 = pauVar15;
              auVar52 = *(undefined1 (*) [16])((long)local_168.data + lVar23 + lVar21);
              auVar53 = *(undefined1 (*) [16])((long)local_168.data + lVar23 + lVar22);
              auVar54 = *(undefined1 (*) [16])((long)local_168.data + lVar23 + lVar28);
              auVar55 = *(undefined1 (*) [16])((long)local_168.data + lVar23 + lVar10);
              auVar56 = vpunpckldq_avx(auVar52,auVar53);
              auVar58 = vpunpckldq_avx(auVar54,auVar55);
              auVar52 = vpunpckhdq_avx(auVar52,auVar53);
              auVar53 = vpunpckhdq_avx(auVar54,auVar55);
              auVar55 = vpunpcklqdq_avx(auVar56,auVar58);
              auVar54 = vpunpckhqdq_avx(auVar56,auVar58);
              auVar56 = vpunpcklqdq_avx(auVar52,auVar53);
              auVar52 = vpunpckhqdq_avx(auVar52,auVar53);
              auVar30._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
              auVar30._16_16_ = ZEXT116(1) * auVar54;
              auVar29._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar56;
              auVar29._16_16_ = ZEXT116(1) * auVar52;
              pauVar15 = (undefined1 (*) [16])((long)pvVar12 + lVar23 * 2 + sVar1 * lVar13 * lVar9);
              auVar52 = vcvtps2ph_f16c(auVar30,3);
              *pauVar15 = auVar52;
              auVar52 = vcvtps2ph_f16c(auVar29,3);
              pauVar15[1] = auVar52;
              iVar11 = iVar11 + 4;
              lVar23 = lVar23 + 0x10;
              pauVar15 = pauVar15 + 2;
            } while (iVar11 < (int)_w);
            pauVar15 = pauVar16 + 2;
            lVar10 = lVar10 + lVar23;
            lVar28 = lVar28 + lVar23;
            lVar22 = lVar22 + lVar23;
            lVar23 = lVar21 + lVar23;
            uVar6 = (uint)local_1c0;
          }
          if ((int)uVar6 < (int)_w) {
            lVar9 = 0;
            do {
              uVar4 = float32_to_float16(*(float *)((long)pvVar18 + lVar9 * 4 + lVar23));
              *(unsigned_short *)(*pauVar15 + lVar9 * 8) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)pvVar18 + lVar9 * 4 + lVar22));
              *(unsigned_short *)(*pauVar15 + lVar9 * 8 + 2) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)pvVar18 + lVar9 * 4 + lVar28));
              *(unsigned_short *)(*pauVar15 + lVar9 * 8 + 4) = uVar4;
              uVar4 = float32_to_float16(*(float *)((long)pvVar18 + lVar9 * 4 + lVar10));
              *(unsigned_short *)(*pauVar15 + lVar9 * 8 + 6) = uVar4;
              lVar9 = lVar9 + 1;
            } while (_w - uVar6 != (int)lVar9);
          }
          uVar25 = uVar25 + 4;
          lVar17 = lVar17 + 4;
          lVar19 = lVar19 + 4;
          lVar20 = lVar20 + 4;
          lVar13 = lVar13 + 1;
          this = local_120;
        } while ((int)((uint)uVar25 | 3) < (int)_h);
      }
      if (local_168.refcount == (int *)0x0) goto LAB_002ca89f;
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount != 0) goto LAB_002ca89f;
      if (local_168.allocator != (Allocator *)0x0) {
        (*(local_168.allocator)->_vptr_Allocator[3])();
        goto LAB_002ca89f;
      }
    }
  }
  else {
LAB_002c9107:
    Mat::reshape(&local_168,this_01,_w,_h,(Allocator *)0x0);
    cast_float32_to_float16(&local_168,this_00,opt);
    if (local_168.refcount == (int *)0x0) goto LAB_002ca89f;
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount != 0) goto LAB_002ca89f;
    if (local_168.allocator != (Allocator *)0x0) {
      (*(local_168.allocator)->_vptr_Allocator[3])();
      goto LAB_002ca89f;
    }
  }
  if (local_168.data != (void *)0x0) {
    free(local_168.data);
  }
LAB_002ca89f:
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_InnerProduct_x86_avx512[-3];
    piVar3 = *(int **)(&this->field_0x138 + (long)p_Var2);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var2) = 0;
    *(undefined1 (*) [16])(&this->field_0x13c + (long)p_Var2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x130 + (long)p_Var2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x158 + (long)p_Var2) = (undefined1  [16])0x0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}